

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O2

ostream * test_detail::
          print_range<std::forward_list<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>
                    (ostream *stream,long *range)

{
  _Fwd_list_const_iterator<unsigned_int> __first;
  ostream *poVar1;
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_11;
  
  std::operator<<(stream,"[");
  if (*range != 0) {
    std::ostream::_M_insert<unsigned_long>((ulong)stream);
    __first = std::next<std::_Fwd_list_const_iterator<unsigned_int>>
                        ((_Fwd_list_node_base *)*range,1);
    __f.proj = &local_11;
    __f.stream = stream;
    std::
    for_each<std::_Fwd_list_const_iterator<unsigned_int>,test_detail::print_range<std::forward_list<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>(std::ostream&,std::forward_list<unsigned_int,std::allocator<unsigned_int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (__first,(_Fwd_list_const_iterator<unsigned_int>)0x0,__f);
  }
  poVar1 = std::operator<<(stream,"]");
  return poVar1;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }